

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::AggressiveDCEPass::ProcessGlobalValues(AggressiveDCEPass *this)

{
  OperandList *this_00;
  byte bVar1;
  Op OVar2;
  Module *pMVar3;
  IRContext *pIVar4;
  DefUseManager *pDVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  bool bVar10;
  bool bVar11;
  CommonDebugInfoInstructions CVar12;
  uint32_t uVar13;
  array<signed_char,_4UL> aVar14;
  uint32_t id;
  const_iterator __cbeg;
  Instruction *pIVar15;
  ulong uVar16;
  Instruction *pIVar17;
  Instruction *pIVar18;
  Operand *__x;
  pointer pOVar19;
  bool bVar20;
  char cVar21;
  uint uVar22;
  Instruction *inst;
  undefined8 *puVar23;
  long lVar24;
  Instruction *val;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> annotations;
  bool local_98;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  undefined8 *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  local_98 = false;
  pIVar15 = *(Instruction **)
             ((long)&(((((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar15 != (Instruction *)0x0) {
    if (pIVar15->opcode_ == OpName) {
      bVar10 = IsTargetDead(this,pIVar15);
      if (bVar10) {
        pIVar15 = IRContext::KillInst((this->super_MemPass).super_Pass.context_,pIVar15);
        local_98 = true;
      }
      else {
        pIVar17 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        pIVar15 = (Instruction *)0x0;
        if ((pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
          pIVar15 = pIVar17;
        }
      }
    }
    else {
      pIVar15 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar15 = (Instruction *)0x0;
      }
    }
  }
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  local_38 = 0;
  pMVar3 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar15 = *(Instruction **)
             ((long)&(pMVar3->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar17 = (Instruction *)
            ((long)&(pMVar3->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (pIVar15 != pIVar17) {
    do {
      local_78._0_8_ = pIVar15;
      std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
      emplace_back<spvtools::opt::Instruction*>
                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                 &local_48,(Instruction **)local_78);
      pIVar15 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar15 != pIVar17);
  }
  puVar9 = puStack_40;
  puVar7 = local_48;
  puVar8 = puStack_40;
  if (local_48 != puStack_40) {
    lVar24 = (long)puStack_40 - (long)local_48;
    uVar16 = lVar24 >> 3;
    lVar6 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
              (local_48,puStack_40,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                (puVar7,puVar9);
      puVar7 = local_48;
      puVar8 = puStack_40;
    }
    else {
      puVar23 = puVar7 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                (puVar7,puVar23);
      for (; puVar7 = local_48, puVar8 = puStack_40, puVar23 != puVar9; puVar23 = puVar23 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Val_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                  (puVar23);
      }
    }
  }
  for (; puVar9 = puStack_40, puVar7 != puStack_40; puVar7 = puVar7 + 1) {
    pIVar15 = (Instruction *)*puVar7;
    OVar2 = pIVar15->opcode_;
    switch(OVar2) {
    case OpDecorationGroup:
      pIVar4 = (this->super_MemPass).super_Pass.context_;
      puStack_40 = puVar8;
      if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar4);
      }
      uVar13 = analysis::DefUseManager::NumUsers
                         ((pIVar4->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,pIVar15);
      bVar10 = uVar13 == 0;
LAB_00526b42:
      if (bVar10) goto LAB_00526dbd;
      break;
    case OpGroupDecorate:
      if (((int)((ulong)((long)(pIVar15->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pIVar15->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 &
          0xfffffffeU) == 0) {
LAB_00526db5:
        bVar10 = true;
        bVar20 = false;
        puStack_40 = puVar8;
      }
      else {
        uVar16 = 1;
        bVar10 = true;
        bVar20 = false;
        puStack_40 = puVar8;
        do {
          pIVar4 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar4);
          }
          pDVar5 = (pIVar4->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl;
          uVar13 = Instruction::GetSingleWordOperand(pIVar15,(uint32_t)uVar16);
          pIVar17 = analysis::DefUseManager::GetDef(pDVar5,uVar13);
          bVar11 = IsLive(this,pIVar17);
          if (bVar11) {
            uVar16 = (ulong)((uint32_t)uVar16 + 1);
            bVar10 = false;
          }
          else {
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                      (&pIVar15->operands_,
                       (pIVar15->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar16);
            bVar20 = true;
            local_98 = true;
          }
        } while ((uint)uVar16 <
                 (uint)((int)((ulong)((long)(pIVar15->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pIVar15->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x55555555));
      }
      goto LAB_00526db9;
    case OpGroupMemberDecorate:
      if (((int)((ulong)((long)(pIVar15->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pIVar15->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 &
          0xfffffffeU) == 0) goto LAB_00526db5;
      this_00 = &pIVar15->operands_;
      uVar22 = 1;
      bVar10 = true;
      bVar20 = false;
      puStack_40 = puVar8;
      do {
        pIVar4 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar4);
        }
        pDVar5 = (pIVar4->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl;
        uVar13 = Instruction::GetSingleWordOperand(pIVar15,uVar22);
        pIVar17 = analysis::DefUseManager::GetDef(pDVar5,uVar13);
        bVar11 = IsLive(this,pIVar17);
        if (bVar11) {
          uVar22 = uVar22 + 2;
          bVar10 = false;
        }
        else {
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (this_00,(this_00->
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             )._M_impl.super__Vector_impl_data._M_start + (uVar22 + 1));
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (this_00,(this_00->
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar22);
          bVar20 = true;
          local_98 = true;
        }
      } while (uVar22 < (uint)((int)((ulong)((long)(pIVar15->operands_).
                                                                                                      
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(pIVar15->operands_).
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x55555555));
LAB_00526db9:
      if (bVar10) goto LAB_00526dbd;
      if ((bVar20) &&
         (pIVar4 = (this->super_MemPass).super_Pass.context_,
         (pIVar4->valid_analyses_ & kAnalysisBegin) != kAnalysisNone)) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar4->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar15);
      }
      break;
    default:
      if (1 < OVar2 - OpDecorateString) {
        if (OVar2 != OpDecorateId) {
          puStack_40 = puVar8;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                        ,0x381,"bool spvtools::opt::AggressiveDCEPass::ProcessGlobalValues()");
        }
        puStack_40 = puVar8;
        bVar10 = IsTargetDead(this,pIVar15);
        if (bVar10) goto LAB_00526dbd;
        uVar22 = (pIVar15->has_result_id_ & 1) + 1;
        if (pIVar15->has_type_id_ == false) {
          uVar22 = (uint)pIVar15->has_result_id_;
        }
        uVar13 = Instruction::GetSingleWordOperand(pIVar15,uVar22 + 1);
        if (uVar13 == 0x1602) {
          uVar22 = (pIVar15->has_result_id_ & 1) + 1;
          if (pIVar15->has_type_id_ == false) {
            uVar22 = (uint)pIVar15->has_result_id_;
          }
          uVar13 = Instruction::GetSingleWordOperand(pIVar15,uVar22 + 2);
          pIVar4 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar4);
          }
          pIVar17 = analysis::DefUseManager::GetDef
                              ((pIVar4->def_use_mgr_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               .
                               super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                               ._M_head_impl,uVar13);
          bVar10 = IsLive(this,pIVar17);
          bVar10 = !bVar10;
          goto LAB_00526b42;
        }
        break;
      }
    case OpDecorate:
    case OpMemberDecorate:
      puStack_40 = puVar8;
      bVar10 = IsTargetDead(this,pIVar15);
      if (bVar10) {
LAB_00526dbd:
        IRContext::KillInst((this->super_MemPass).super_Pass.context_,pIVar15);
        local_98 = true;
      }
    }
    puVar8 = puStack_40;
    puStack_40 = puVar9;
  }
  pMVar3 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar15 = *(Instruction **)
             ((long)&(pMVar3->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  pIVar17 = (Instruction *)
            ((long)&(pMVar3->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
            8);
  puStack_40 = puVar8;
  if (pIVar15 != pIVar17) {
    do {
      bVar10 = IsLive(this,pIVar15);
      if (!bVar10) {
        CVar12 = Instruction::GetCommonDebugOpcode(pIVar15);
        if (CVar12 == CommonDebugInfoDebugGlobalVariable) {
          uVar13 = Instruction::GetSingleWordOperand(pIVar15,0xc);
          pIVar4 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar4);
          }
          pIVar18 = analysis::DefUseManager::GetDef
                              ((pIVar4->def_use_mgr_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               .
                               super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                               ._M_head_impl,uVar13);
          bVar10 = IsLive(this,pIVar18);
          if (!bVar10) {
            IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar15);
            pIVar4 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar4->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
              IRContext::BuildDebugInfoManager(pIVar4);
            }
            pIVar18 = analysis::DebugInfoManager::GetDebugInfoNone
                                ((pIVar4->debug_info_mgr_)._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                                 .
                                 super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                                 ._M_head_impl);
            aVar14._M_elems[0] = '\0';
            aVar14._M_elems[1] = '\0';
            aVar14._M_elems[2] = '\0';
            aVar14._M_elems[3] = '\0';
            if (pIVar18->has_result_id_ == true) {
              aVar14._M_elems =
                   (_Type)Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
            }
            local_78._0_8_ = &PTR__SmallVector_00b15d78;
            local_78._24_8_ = local_78 + 0x10;
            local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_78._16_4_ = aVar14._M_elems;
            local_78._8_8_ = (pointer)0x1;
            pOVar19 = (pIVar15->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pIVar15->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar19 >> 4) *
                       -0x5555555555555555) < 0xd) {
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2b8,
                            "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                           );
            }
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar19[0xc].words,(SmallVector<unsigned_int,_2UL> *)local_78);
            local_78._0_8_ = &PTR__SmallVector_00b15d78;
            if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_58,local_58._M_head_impl);
            }
            IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar15);
          }
        }
        else {
          local_78._0_8_ = pIVar15;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&this->to_kill_,(Instruction **)local_78);
          local_98 = true;
        }
      }
      pIVar15 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar15 != pIVar17);
  }
  pMVar3 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar15 = *(Instruction **)
             ((long)&(pMVar3->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar17 = (Instruction *)
            ((long)&(pMVar3->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (pIVar15 != pIVar17) {
    do {
      bVar10 = IsLive(this,pIVar15);
      if (!bVar10) {
        if (pIVar15->opcode_ == OpTypeForwardPointer) {
          uVar13 = (pIVar15->has_result_id_ & 1) + 1;
          if (pIVar15->has_type_id_ == false) {
            uVar13 = (uint)pIVar15->has_result_id_;
          }
          uVar13 = Instruction::GetSingleWordOperand(pIVar15,uVar13);
          pIVar4 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar4);
          }
          pIVar18 = analysis::DefUseManager::GetDef
                              ((pIVar4->def_use_mgr_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               .
                               super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                               ._M_head_impl,uVar13);
          bVar10 = IsLive(this,pIVar18);
          if (bVar10) goto LAB_00527027;
        }
        local_78._0_8_ = pIVar15;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&this->to_kill_,(Instruction **)local_78);
        local_98 = true;
      }
LAB_00527027:
      pIVar15 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar15 != pIVar17);
  }
  if (this->preserve_interface_ == false) {
    pMVar3 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar15 = *(Instruction **)
               ((long)&(pMVar3->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    pIVar17 = (Instruction *)
              ((long)&(pMVar3->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    if (pIVar15 != pIVar17) {
      do {
        local_78._0_8_ = (Instruction *)0x0;
        local_78._8_8_ = (pointer)0x0;
        local_78._16_4_ = (array<signed_char,_4UL>)0x0;
        local_78._20_4_ = (array<signed_char,_4UL>)0x0;
        pOVar19 = (pIVar15->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)(pIVar15->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar19;
        cVar21 = pIVar15->has_type_id_;
        bVar1 = pIVar15->has_result_id_;
        uVar22 = (bVar1 & 1) + 1;
        if ((bool)cVar21 == false) {
          uVar22 = (uint)bVar1;
        }
        uVar22 = (int)(uVar16 >> 4) * -0x55555555 - uVar22;
        if (uVar22 != 0) {
          uVar13 = 0;
          do {
            if (uVar13 < 3) {
LAB_00527108:
              __x = Instruction::GetInOperand(pIVar15,uVar13);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_78,__x);
            }
            else {
              pIVar4 = (this->super_MemPass).super_Pass.context_;
              if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar4);
              }
              pDVar5 = (pIVar4->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl;
              uVar22 = (pIVar15->has_result_id_ & 1) + 1;
              if (pIVar15->has_type_id_ == false) {
                uVar22 = (uint)pIVar15->has_result_id_;
              }
              id = Instruction::GetSingleWordOperand(pIVar15,uVar22 + uVar13);
              pIVar18 = analysis::DefUseManager::GetDef(pDVar5,id);
              bVar10 = IsLive(this,pIVar18);
              if (bVar10) goto LAB_00527108;
            }
            uVar13 = uVar13 + 1;
            pOVar19 = (pIVar15->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar16 = (long)(pIVar15->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar19;
            cVar21 = pIVar15->has_type_id_;
            bVar1 = pIVar15->has_result_id_;
            uVar22 = (bVar1 & 1) + 1;
            if ((bool)cVar21 == false) {
              uVar22 = (uint)bVar1;
            }
            uVar22 = (int)(uVar16 >> 4) * -0x55555555 - uVar22;
          } while (uVar13 < uVar22);
        }
        if (((long)(local_78._8_8_ - local_78._0_8_) >> 4) * -0x5555555555555555 - (ulong)uVar22 !=
            0) {
          uVar22 = (uint)bVar1;
          if (cVar21 != '\0') {
            uVar22 = (bVar1 & 1) + 1;
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (&pIVar15->operands_,
                     (Operand *)
                     ((long)((pOVar19->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar22 * 0x30))
                     ,(Operand *)((long)((pOVar19->words).buffer + 0xfffffffffffffffa) + uVar16));
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &pIVar15->operands_,
                     (pIVar15->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_78._0_8_,local_78._8_8_);
          pIVar4 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar4);
          }
          analysis::DefUseManager::UpdateDefUse
                    ((pIVar4->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,pIVar15);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_78);
        pIVar15 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar15 != pIVar17);
    }
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return local_98;
}

Assistant:

bool AggressiveDCEPass::ProcessGlobalValues() {
  // Remove debug and annotation statements referencing dead instructions.
  // This must be done before killing the instructions, otherwise there are
  // dead objects in the def/use database.
  bool modified = false;
  Instruction* instruction = &*get_module()->debug2_begin();
  while (instruction) {
    if (instruction->opcode() != spv::Op::OpName) {
      instruction = instruction->NextNode();
      continue;
    }

    if (IsTargetDead(instruction)) {
      instruction = context()->KillInst(instruction);
      modified = true;
    } else {
      instruction = instruction->NextNode();
    }
  }

  // This code removes all unnecessary decorations safely (see #1174). It also
  // does so in a more efficient manner than deleting them only as the targets
  // are deleted.
  std::vector<Instruction*> annotations;
  for (auto& inst : get_module()->annotations()) annotations.push_back(&inst);
  std::sort(annotations.begin(), annotations.end(), DecorationLess());
  for (auto annotation : annotations) {
    switch (annotation->opcode()) {
      case spv::Op::OpDecorate:
      case spv::Op::OpMemberDecorate:
      case spv::Op::OpDecorateStringGOOGLE:
      case spv::Op::OpMemberDecorateStringGOOGLE:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      case spv::Op::OpDecorateId:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        } else {
          if (spv::Decoration(annotation->GetSingleWordInOperand(1)) ==
              spv::Decoration::HlslCounterBufferGOOGLE) {
            // HlslCounterBuffer will reference an id other than the target.
            // If that id is dead, then the decoration can be removed as well.
            uint32_t counter_buffer_id = annotation->GetSingleWordInOperand(2);
            Instruction* counter_buffer_inst =
                get_def_use_mgr()->GetDef(counter_buffer_id);
            if (!IsLive(counter_buffer_inst)) {
              context()->KillInst(annotation);
              modified = true;
            }
          }
        }
        break;
      case spv::Op::OpGroupDecorate: {
        // Go through the targets of this group decorate. Remove each dead
        // target. If all targets are dead, remove this decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i++;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpGroupMemberDecorate: {
        // Go through the targets of this group member decorate. Remove each
        // dead target (and member index). If all targets are dead, remove this
        // decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i + 1);
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i += 2;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpDecorationGroup:
        // By the time we hit decoration groups we've checked everything that
        // can target them. So if they have no uses they must be dead.
        if (get_def_use_mgr()->NumUsers(annotation) == 0) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      default:
        assert(false);
        break;
    }
  }

  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (IsLive(&dbg)) continue;
    // Save GlobalVariable if its variable is live, otherwise null out variable
    // index
    if (dbg.GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
      auto var_id = dbg.GetSingleWordOperand(kGlobalVariableVariableIndex);
      Instruction* var_inst = get_def_use_mgr()->GetDef(var_id);
      if (IsLive(var_inst)) continue;
      context()->ForgetUses(&dbg);
      dbg.SetOperand(
          kGlobalVariableVariableIndex,
          {context()->get_debug_info_mgr()->GetDebugInfoNone()->result_id()});
      context()->AnalyzeUses(&dbg);
      continue;
    }
    to_kill_.push_back(&dbg);
    modified = true;
  }

  // Since ADCE is disabled for non-shaders, we don't check for export linkage
  // attributes here.
  for (auto& val : get_module()->types_values()) {
    if (!IsLive(&val)) {
      // Save forwarded pointer if pointer is live since closure does not mark
      // this live as it does not have a result id. This is a little too
      // conservative since it is not known if the structure type that needed
      // it is still live. TODO(greg-lunarg): Only save if needed.
      if (val.opcode() == spv::Op::OpTypeForwardPointer) {
        uint32_t ptr_ty_id = val.GetSingleWordInOperand(0);
        Instruction* ptr_ty_inst = get_def_use_mgr()->GetDef(ptr_ty_id);
        if (IsLive(ptr_ty_inst)) continue;
      }
      to_kill_.push_back(&val);
      modified = true;
    }
  }

  if (!preserve_interface_) {
    // Remove the dead interface variables from the entry point interface list.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        if (i < 3) {
          // Execution model, function id and name are always valid.
          new_operands.push_back(entry.GetInOperand(i));
        } else {
          auto* var =
              get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
          if (IsLive(var)) {
            new_operands.push_back(entry.GetInOperand(i));
          }
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        get_def_use_mgr()->UpdateDefUse(&entry);
      }
    }
  }

  return modified;
}